

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O2

Builder * __thiscall
capnp::anon_unknown_0::MembraneCallContextHook::getResults
          (Builder *__return_storage_ptr__,MembraneCallContextHook *this,
          Maybe<capnp::MessageSize> *sizeHint)

{
  anon_union_24_1_a8c68091_for_NullableValue<capnp::AnyPointer::Builder>_2 *paVar1;
  CallContextHook *pCVar2;
  CapTableBuilder *pCVar3;
  Builder builder;
  Builder *r;
  char local_50 [8];
  uint64_t local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  WirePointer *local_28;
  
  paVar1 = &(this->results).ptr.field_1;
  if ((this->results).ptr.isSet == true) {
    (__return_storage_ptr__->builder).pointer = (this->results).ptr.field_1.value.builder.pointer;
    pCVar3 = (this->results).ptr.field_1.value.builder.capTable;
    (__return_storage_ptr__->builder).segment = (paVar1->value).builder.segment;
    (__return_storage_ptr__->builder).capTable = pCVar3;
  }
  else {
    pCVar2 = (this->inner).ptr;
    local_50[0] = (sizeHint->ptr).isSet;
    if ((bool)local_50[0] == true) {
      local_48 = (sizeHint->ptr).field_1.value.wordCount;
      uStack_40 = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
    }
    (*pCVar2->_vptr_CallContextHook[2])(&local_38,pCVar2,local_50);
    builder.builder.capTable = (CapTableBuilder *)uStack_30;
    builder.builder.segment = (SegmentBuilder *)local_38;
    builder.builder.pointer = local_28;
    MembraneCapTableBuilder::imbue(__return_storage_ptr__,&this->resultsCapTable,builder);
    (this->results).ptr.field_1.value.builder.pointer = (__return_storage_ptr__->builder).pointer;
    pCVar3 = (__return_storage_ptr__->builder).capTable;
    (paVar1->value).builder.segment = (__return_storage_ptr__->builder).segment;
    (this->results).ptr.field_1.value.builder.capTable = pCVar3;
    (this->results).ptr.isSet = true;
  }
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Builder getResults(kj::Maybe<MessageSize> sizeHint) override {
    KJ_IF_SOME(r, results) {
      return r;
    } else {
      auto result = resultsCapTable.imbue(inner->getResults(sizeHint));
      results = result;
      return result;
    }